

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O2

void __thiscall Fl_Shared_Image::Fl_Shared_Image(Fl_Shared_Image *this,char *n,Fl_Image *img)

{
  size_t sVar1;
  char *__dest;
  
  Fl_Image::Fl_Image(&this->super_Fl_Image,0,0,0);
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_Shared_Image_002584c8;
  sVar1 = strlen(n);
  __dest = (char *)operator_new__(sVar1 + 1);
  this->name_ = __dest;
  strcpy(__dest,n);
  this->image_ = img;
  this->alloc_image_ = (uint)(img == (Fl_Image *)0x0);
  this->original_ = 1;
  this->refcount_ = 1;
  if (img != (Fl_Image *)0x0) {
    update(this);
    return;
  }
  reload(this);
  return;
}

Assistant:

Fl_Shared_Image::Fl_Shared_Image(const char *n,		// I - Filename
                                 Fl_Image   *img)	// I - Image
  : Fl_Image(0,0,0) {
  name_ = new char[strlen(n) + 1];
  strcpy((char *)name_, n);

  refcount_    = 1;
  image_       = img;
  alloc_image_ = !img;
  original_    = 1;
#if FLTK_ABI_VERSION >= 10304
  scaled_image_= 0;
#endif

  if (!img) reload();
  else update();
}